

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

uint16_t TileData::rowBitplanes(Tile *tile,Palette *palette,uint32_t y)

{
  Palette *this;
  byte bVar1;
  byte bVar2;
  uint16_t color;
  Rgba local_29;
  byte local_25;
  uint local_24;
  ushort uStack_1e;
  uint8_t index;
  uint32_t x;
  uint16_t row;
  Palette *pPStack_18;
  uint32_t y_local;
  Palette *palette_local;
  Tile *tile_local;
  
  uStack_1e = 0;
  local_24 = 0;
  x = y;
  pPStack_18 = palette;
  palette_local = (Palette *)tile;
  while( true ) {
    this = pPStack_18;
    if (7 < local_24) {
      return uStack_1e;
    }
    uStack_1e = uStack_1e << 1;
    local_29 = Png::TilesVisitor::Tile::pixel((Tile *)palette_local,local_24,x);
    color = Rgba::cgbColor(&local_29);
    bVar1 = Palette::indexOf(this,color);
    local_25 = bVar1;
    bVar2 = Palette::size(pPStack_18);
    if (bVar2 <= bVar1) break;
    if ((local_25 & 1) != 0) {
      uStack_1e = uStack_1e | 1;
    }
    if ((local_25 & 2) != 0) {
      uStack_1e = uStack_1e | 0x100;
    }
    local_24 = local_24 + 1;
  }
  __assert_fail("index < palette.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                ,0x2a9,"rowBitplanes");
}

Assistant:

static uint16_t rowBitplanes(Png::TilesVisitor::Tile const &tile, Palette const &palette,
	                             uint32_t y) {
		uint16_t row = 0;
		for (uint32_t x = 0; x < 8; ++x) {
			row <<= 1;
			uint8_t index = palette.indexOf(tile.pixel(x, y).cgbColor());
			assert(index < palette.size()); // The color should be in the palette
			if (index & 1) {
				row |= 1;
			}
			if (index & 2) {
				row |= 0x100;
			}
		}
		return row;
	}